

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_GENERIC::DeSerialize(SRUP_MSG_GENERIC *this,uchar *serial_data)

{
  bool bVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  uchar *snd_byte;
  uint8_t *__end1_1;
  uint8_t *__begin1_1;
  uint8_t (*__range1_1) [8];
  uint8_t snd_bytes [8];
  uchar *sid_byte;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [8];
  uint8_t sid_bytes [8];
  uint8_t bytes [2];
  uint16_t x;
  uint p;
  uchar *serial_data_local;
  SRUP_MSG_GENERIC *this_local;
  
  *(this->super_SRUP_MSG).m_version = *serial_data;
  *(this->super_SRUP_MSG).m_msgtype = serial_data[1];
  sid_bytes[4] = '\x02';
  sid_bytes[5] = '\0';
  sid_bytes[6] = '\0';
  sid_bytes[7] = '\0';
  if (*(this->super_SRUP_MSG).m_version == '\x05') {
    bVar1 = ValidMessageType((this->super_SRUP_MSG).m_msgtype);
    if (bVar1) {
      for (__end1 = (uint8_t *)&__range1; __end1 != sid_bytes; __end1 = __end1 + 1) {
        snd_bytes = (uint8_t  [8])__end1;
        *__end1 = serial_data[(uint)sid_bytes._4_4_];
        sid_bytes._4_4_ = sid_bytes._4_4_ + 1;
      }
      if (((this->super_SRUP_MSG).m_sequence_ID != (uint64_t *)0x0) &&
         (puVar2 = (this->super_SRUP_MSG).m_sequence_ID, puVar2 != (uint64_t *)0x0)) {
        operator_delete(puVar2);
      }
      puVar2 = (uint64_t *)operator_new(8);
      (this->super_SRUP_MSG).m_sequence_ID = puVar2;
      *(this->super_SRUP_MSG).m_sequence_ID = (uint64_t)__range1;
      for (__end1_1 = (uint8_t *)&__range1_1; __end1_1 != snd_bytes; __end1_1 = __end1_1 + 1) {
        *__end1_1 = serial_data[(uint)sid_bytes._4_4_];
        sid_bytes._4_4_ = sid_bytes._4_4_ + 1;
      }
      if (((this->super_SRUP_MSG).m_sender_ID != (uint64_t *)0x0) &&
         (puVar2 = (this->super_SRUP_MSG).m_sender_ID, puVar2 != (uint64_t *)0x0)) {
        operator_delete(puVar2);
      }
      puVar2 = (uint64_t *)operator_new(8);
      (this->super_SRUP_MSG).m_sender_ID = puVar2;
      *(this->super_SRUP_MSG).m_sender_ID = (uint64_t)__range1_1;
      sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._4_4_);
      sid_bytes._2_2_ = SRUP_MSG::decodeLength(sid_bytes);
      sid_bytes._4_4_ = sid_bytes._4_4_ + 2;
      puVar3 = (this->super_SRUP_MSG).m_token;
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      puVar3 = (uint8_t *)operator_new__((ulong)(ushort)sid_bytes._2_2_);
      (this->super_SRUP_MSG).m_token = puVar3;
      memcpy((this->super_SRUP_MSG).m_token,serial_data + (uint)sid_bytes._4_4_,
             (ulong)(ushort)sid_bytes._2_2_);
      (this->super_SRUP_MSG).m_token_len = sid_bytes._2_2_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG_GENERIC::DeSerialize(const unsigned char* serial_data)
{
    unsigned int p=0;
    uint16_t x;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We'll only try to extract the "generic" fields (version, type, sequence ID, sender ID, token)

    std::memcpy(m_version, serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, serial_data + p, 1);
    p+=1;

    // Given that we'll typically deserialize first into the generic message format - we need to try to validate that
    // this is a valid message ... and not some other type of data on the MQTT topic...
    // We'll try checking that the version is okay...

    if (*m_version != SRUP::SRUP_VERSION)
        return false;

    if (not (ValidMessageType (m_msgtype)))
        return false;

    // If we make it to here – there's a good chance the message is a valid one...

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t *) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete (m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // We will also unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t *) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sender_ID
    if (m_sender_ID != nullptr)
        delete (m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now the token - the last of the "generic" fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p += 2;
    delete[] m_token;
    m_token = new uint8_t[x];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;

    return true;
}